

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QSynth.cpp
# Opt level: O0

void QReportHandler::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int _t1;
  undefined4 *puVar1;
  code *pcVar2;
  int *result;
  QString local_58;
  QString local_40;
  QObject *local_28;
  QReportHandler *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    local_28 = _o;
    _t = (QReportHandler *)_a;
    _a_local._0_4_ = _id;
    _a_local._4_4_ = _c;
    __id_local = _o;
    switch(_id) {
    case 0:
      balloonMessageAppeared((QReportHandler *)_o,(QString *)_a[1],(QString *)_a[2]);
      break;
    case 1:
      masterVolumeChanged((QReportHandler *)_o,*_a[1]);
      break;
    case 2:
      reverbModeChanged((QReportHandler *)_o,*_a[1]);
      break;
    case 3:
      reverbTimeChanged((QReportHandler *)_o,*_a[1]);
      break;
    case 4:
      reverbLevelChanged((QReportHandler *)_o,*_a[1]);
      break;
    case 5:
      polyStateChanged((QReportHandler *)_o,*_a[1]);
      break;
    case 6:
      _t1 = *_a[1];
      QString::QString(&local_40,(QString *)_a[2]);
      QString::QString(&local_58,*(QString **)(_t + 1));
      programChanged((QReportHandler *)_o,_t1,&local_40,&local_58);
      QString::~QString(&local_58);
      QString::~QString(&local_40);
      break;
    case 7:
      lcdStateChanged((QReportHandler *)_o);
      break;
    case 8:
      midiMessageLEDStateChanged((QReportHandler *)_o,(bool)(*_a[1] & 1));
    }
  }
  else if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    if (pcVar2 == balloonMessageAppeared &&
        (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *puVar1 = 0;
    }
    else {
      pcVar2 = *_a[1];
      if (pcVar2 == masterVolumeChanged &&
          (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *puVar1 = 1;
      }
      else {
        pcVar2 = *_a[1];
        if (pcVar2 == reverbModeChanged &&
            (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
          *puVar1 = 2;
        }
        else {
          pcVar2 = *_a[1];
          if (pcVar2 == reverbTimeChanged &&
              (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
            *puVar1 = 3;
          }
          else {
            pcVar2 = *_a[1];
            if (pcVar2 == reverbLevelChanged &&
                (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
              *puVar1 = 4;
            }
            else {
              pcVar2 = *_a[1];
              if (pcVar2 == polyStateChanged &&
                  (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
                *puVar1 = 5;
              }
              else {
                pcVar2 = *_a[1];
                if (pcVar2 == programChanged &&
                    (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
                  *puVar1 = 6;
                }
                else {
                  pcVar2 = *_a[1];
                  if (pcVar2 == lcdStateChanged &&
                      (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
                    *puVar1 = 7;
                  }
                  else {
                    pcVar2 = *_a[1];
                    if (pcVar2 == midiMessageLEDStateChanged &&
                        (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
                      *puVar1 = 8;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void QReportHandler::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QReportHandler *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->balloonMessageAppeared((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 1: _t->masterVolumeChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->reverbModeChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->reverbTimeChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->reverbLevelChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->polyStateChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->programChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 7: _t->lcdStateChanged(); break;
        case 8: _t->midiMessageLEDStateChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QReportHandler::*)(const QString & , const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::balloonMessageAppeared)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::masterVolumeChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::reverbModeChanged)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::reverbTimeChanged)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::reverbLevelChanged)) {
                *result = 4;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::polyStateChanged)) {
                *result = 5;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int , QString , QString );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::programChanged)) {
                *result = 6;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::lcdStateChanged)) {
                *result = 7;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::midiMessageLEDStateChanged)) {
                *result = 8;
                return;
            }
        }
    }
}